

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_mem.c
# Opt level: O2

void * aom_malloc(size_t size)

{
  void *pvVar1;
  
  pvVar1 = aom_memalign(0x10,size);
  return pvVar1;
}

Assistant:

void *aom_malloc(size_t size) { return aom_memalign(DEFAULT_ALIGNMENT, size); }